

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.h
# Opt level: O1

void __thiscall Coordinate::turnTo(Coordinate *this,TURNCODE turn)

{
  FACING FVar1;
  FACING FVar2;
  
  FVar2 = turn + this->facing;
  FVar1 = NORTH;
  if (FVar2 != 4) {
    FVar1 = FVar2;
  }
  FVar2 = WEST;
  if (FVar1 != ~NORTH) {
    FVar2 = FVar1;
  }
  this->facing = FVar2;
  switch(FVar2) {
  case NORTH:
    this = (Coordinate *)&this->y;
    FVar2 = EAST;
    break;
  case EAST:
    break;
  case SOUTH:
    this = (Coordinate *)&this->y;
  case WEST:
    FVar2 = ~NORTH;
    break;
  default:
    goto switchD_0010b086_default;
  }
  this->x = this->x + FVar2;
switchD_0010b086_default:
  return;
}

Assistant:

void turnTo(TURNCODE turn){
        /*        N = 0
         *    W = 3    E = 1
         *        S = 2
         */
        int newFacing = facing + turn;
        if (newFacing == 4){
            newFacing = 0;
        }
        if (newFacing == -1){
            newFacing = 3;
        }
        facing = (FACING) newFacing;

        switch (facing){
            case NORTH:
                y += 1;
                break;
            case EAST:
                x += 1;
                break;
            case SOUTH:
                y -= 1;
                break;
            case WEST:
                x -= 1;
                break;
        }
    }